

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint32_t *puVar5;
  long lVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  long lVar10;
  mbedtls_aes_context cty;
  mbedtls_aes_context local_150;
  
  memset(&local_150,0,0x120);
  ctx->rk = ctx->buf;
  iVar3 = mbedtls_aes_setkey_enc(&local_150,key,keybits);
  if (iVar3 == 0) {
    ctx->nr = local_150.nr;
    iVar4 = mbedtls_aesni_has_support(0x2000000);
    if (iVar4 == 0) {
      local_150.rk = local_150.rk + (long)local_150.nr * 4;
      puVar8 = local_150.rk + -4;
      ctx->buf[0] = *local_150.rk;
      ctx->buf[1] = local_150.rk[1];
      ctx->buf[2] = local_150.rk[2];
      puVar7 = ctx->buf + 4;
      ctx->buf[3] = local_150.rk[3];
      iVar4 = ctx->nr;
      if (1 < iVar4) {
        do {
          puVar9 = puVar7;
          puVar5 = puVar8;
          lVar10 = 0;
          lVar6 = 0;
          do {
            uVar1 = puVar5[lVar10];
            puVar9[lVar10] =
                 RT1[FSb[uVar1 >> 8 & 0xff]] ^ RT0[FSb[uVar1 & 0xff]] ^
                 RT2[FSb[uVar1 >> 0x10 & 0xff]] ^ RT3[FSb[uVar1 >> 0x18]];
            lVar6 = lVar6 + -4;
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 4);
          bVar2 = 2 < iVar4;
          puVar8 = (uint32_t *)((long)puVar5 + (-0x20 - lVar6));
          puVar7 = (uint32_t *)((long)puVar9 - lVar6);
          iVar4 = iVar4 + -1;
        } while (bVar2);
        puVar8 = (uint32_t *)((long)puVar5 + (-0x20 - lVar6));
        puVar7 = (uint32_t *)((long)puVar9 - lVar6);
      }
      *puVar7 = *puVar8;
      puVar7[1] = puVar8[1];
      puVar7[2] = puVar8[2];
      puVar7[3] = puVar8[3];
    }
    else {
      mbedtls_aesni_inverse_key((uchar *)ctx->rk,(uchar *)local_150.rk,ctx->nr);
    }
  }
  lVar6 = 0;
  do {
    *(undefined1 *)((long)local_150.buf + lVar6 + -0x10) = 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x120);
  return iVar3;
}

Assistant:

int mbedtls_aes_setkey_dec( mbedtls_aes_context *ctx, const unsigned char *key,
                    unsigned int keybits )
{
    int i, j, ret;
    mbedtls_aes_context cty;
    uint32_t *RK;
    uint32_t *SK;

    mbedtls_aes_init( &cty );

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_PADLOCK_ALIGN16)
    if( aes_padlock_ace == -1 )
        aes_padlock_ace = mbedtls_padlock_has_support( MBEDTLS_PADLOCK_ACE );

    if( aes_padlock_ace )
        ctx->rk = RK = MBEDTLS_PADLOCK_ALIGN16( ctx->buf );
    else
#endif
    ctx->rk = RK = ctx->buf;

    /* Also checks keybits */
    if( ( ret = mbedtls_aes_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
    {
        mbedtls_aesni_inverse_key( (unsigned char *) ctx->rk,
                           (const unsigned char *) cty.rk, ctx->nr );
        goto exit;
    }
#endif

    SK = cty.rk + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = ctx->nr - 1, SK -= 8; i > 0; i--, SK -= 8 )
    {
        for( j = 0; j < 4; j++, SK++ )
        {
            *RK++ = AES_RT0( FSb[ ( *SK       ) & 0xFF ] ) ^
                    AES_RT1( FSb[ ( *SK >>  8 ) & 0xFF ] ) ^
                    AES_RT2( FSb[ ( *SK >> 16 ) & 0xFF ] ) ^
                    AES_RT3( FSb[ ( *SK >> 24 ) & 0xFF ] );
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_aes_free( &cty );

    return( ret );
}